

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

Suite * private_ACUtilsTest_AString_getTestSuite(void)

{
  Suite *s_00;
  TCase *pTVar1;
  TCase *test_case_AString_split;
  TCase *test_case_AString_substring;
  TCase *test_case_AString_clone;
  TCase *test_case_AString_compareCString;
  TCase *test_case_AString_compare;
  TCase *test_case_AString_equalsCString;
  TCase *test_case_AString_equals;
  TCase *test_case_AString_replaceAString;
  TCase *test_case_AString_replaceCString;
  TCase *test_case_AString_replace;
  TCase *test_case_AString_replaceRangeAString;
  TCase *test_case_AString_replaceRangeCString;
  TCase *test_case_AString_replaceRange;
  TCase *test_case_AString_setRange;
  TCase *test_case_AString_set;
  TCase *test_case_AString_get;
  TCase *test_case_AString_appendAString;
  TCase *test_case_AString_appendCString;
  TCase *test_case_AString_append;
  TCase *test_case_AString_insertAString;
  TCase *test_case_AString_insertCString;
  TCase *test_case_AString_insert;
  TCase *test_case_AString_trimBack;
  TCase *test_case_AString_trimFront;
  TCase *test_case_AString_trim;
  TCase *test_case_AString_remove;
  TCase *test_case_AString_clear;
  TCase *test_case_AString_shrinkToFit;
  TCase *test_case_AString_reserve;
  TCase *test_case_AString_buffer;
  TCase *test_case_AString_capacity;
  TCase *test_case_AString_size;
  TCase *test_case_AString_deallocator;
  TCase *test_case_AString_reallocator;
  TCase *test_case_AString_construct_destruct;
  Suite *s;
  
  s_00 = suite_create("AString Test Suite");
  pTVar1 = tcase_create("AString Test Case: AString_construct / AString_destruct");
  _tcase_add_test(pTVar1,test_AString_construct_destruct_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_fromCString_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_withAllocator_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_fromCStringWithAllocator_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_withCapacityAndAllocator_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_withAllocator_invalid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_fromCStringWithAllocator_invalid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_withCapacityAndAllocator_invalid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_withAllocator_noMemoryAvailable,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_fromCStringWithAllocator_noMemoryAvailable,
                  0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_withCapacityAndAllocator_noMemoryAvailable,
                  0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_construct_destruct_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_reallocator");
  _tcase_add_test(pTVar1,test_AString_reallocator_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_reallocator_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_deallocator");
  _tcase_add_test(pTVar1,test_AString_deallocator_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_deallocator_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_size");
  _tcase_add_test(pTVar1,test_AString_size_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_size_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_capacity");
  _tcase_add_test(pTVar1,test_AString_capacity_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_capacity_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_buffer");
  _tcase_add_test(pTVar1,test_AString_buffer_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_buffer_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_reserve");
  _tcase_add_test(pTVar1,test_AString_reserve_success_enoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_reserve_success_notEnoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_reserve_success_notEnoughCapacity_overMaxAlloc,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_reserve_failure_noMemoryAvailable,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_reserve_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_shrinkToFit");
  _tcase_add_test(pTVar1,test_AString_shrinkToFit_success_hasLeastCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_shrinkToFit_success_smallerThanMinSize,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_shrinkToFit_success_hasNotLeastCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_shrinkToFit_failure_noMemoryAvailable,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_shrinkToFit_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_clear");
  _tcase_add_test(pTVar1,test_AString_clear,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_clear_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_remove");
  _tcase_add_test(pTVar1,test_AString_remove_indexRangeInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_remove_rangeBeyondBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_remove_zeroRange,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_remove_indexBeyoundBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_remove_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_trim");
  _tcase_add_test(pTVar1,test_AString_trim_trimmed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trim_frontTrimming,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trim_backTrimming,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trim_frontAndBackTrimming,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trim_completeString,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trim_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_trimFront");
  _tcase_add_test(pTVar1,test_AString_trimFront_trimmed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trimFront_trimming,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trimFront_completeString,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trimFront_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_trimBack");
  _tcase_add_test(pTVar1,test_AString_trimBack_trimmed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trimBack_trimming,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trimBack_completeString,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_trimBack_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_insert");
  _tcase_add_test(pTVar1,test_AString_insert_success_zeroIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insert_success_middleIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insert_success_beyondEndIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insert_success_nullTerminator,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insert_success_bufferExpanded,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insert_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insert_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_insertCString");
  _tcase_add_test(pTVar1,test_AString_insertCString_success_zeroIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertCString_success_middleIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertCString_success_endIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertCString_success_beyondEndIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertArray_success_bufferExpanded,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertArray_success_nullptrArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertArray_success_zeroArraySize,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertArray_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertArray_failure_nullptrDestArray,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_insertAString");
  _tcase_add_test(pTVar1,test_AString_insertAString_success_zeroIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertAString_success_middleIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertAString_success_endIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertAString_success_beyondEndIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertAString_success_bufferExpanded,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertAString_success_nullptrSrcArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertAString_success_zeroSizeSrcArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertAString_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_insertAString_failure_nullptrDestArray,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_append");
  _tcase_add_test(pTVar1,test_AString_append_success_enoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_append_success_nullTerminator,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_append_success_notEnoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_append_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_append_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_appendCString");
  _tcase_add_test(pTVar1,test_AString_appendCString_success_enoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendCString_success_notEnoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendCString_success_nullptrArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendCString_success_zeroArraySize,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendCString_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendCString_failure_nullptrDestArray,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_appendAString");
  _tcase_add_test(pTVar1,test_AString_appendAString_success_enoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendAString_success_notEnoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendAString_success_nullptrSrcArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendAString_success_zeroSizeSrcArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendAString_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_appendAString_failure_nullptrDestArray,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_get");
  _tcase_add_test(pTVar1,test_AString_get_indexInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_get_indexOutOfBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_get_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_set");
  _tcase_add_test(pTVar1,test_AString_set_success_indexInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_set_success_indexBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_set_success_indexBeyondSize_bufferExpanded,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_set_failure_indexBeyondSize_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_set_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_setRange");
  _tcase_add_test(pTVar1,test_AString_setRange_success_indexAndRangeInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_setRange_success_indexInBoundsRangeBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_setRange_success_indexInBoundsRangeBeyondSize_bufferExpanded,0
                  ,0,0,1);
  _tcase_add_test(pTVar1,test_AString_setRange_success_indexAndRangeBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_setRange_success_indexAndRangeBeyondSize_bufferExpanded,0,0,0,
                  1);
  _tcase_add_test(pTVar1,
                  test_AString_setRange_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed,0
                  ,0,0,1);
  _tcase_add_test(pTVar1,test_AString_setRange_failure_indexAndRangeBeyondSize_bufferExpansionFailed
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_setRange_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_replaceRange");
  _tcase_add_test(pTVar1,test_AString_replaceRange_success_indexAndRangeInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRange_success_zeroCount,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRange_success_smallerReplaceLength,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRange_success_biggerReplaceLength,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRange_success_biggerReplaceLength_bufferExpanded,0,0,0,
                  1);
  _tcase_add_test(pTVar1,test_AString_replaceRange_success_zeroReplaceLength,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRange_success_indexInBoundsRangeBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRange_success_indexInBoundsRangeBeyondSize_bufferExpanded,0,0,
                  0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRange_success_indexAndRangeBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRange_success_indexAndRangeBeyondSize_bufferExpanded,0,
                  0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRange_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRange_failure_indexAndRangeBeyondSize_bufferExpansionFailed,0,
                  0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRange_failure_nullptrDestString,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_replaceRangeCString");
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_indexAndRangeInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_zeroCount,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_notAllOfReplaceArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_nullptrReplaceArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_smallerReplaceLength,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_biggerReplaceLength,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_biggerReplaceLength_bufferExpanded
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_zeroReplaceLength,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_indexInBoundsRangeBeyondSize,0,0,0
                  ,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRangeCString_success_indexInBoundsRangeBeyondSize_bufferExpanded
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_success_indexAndRangeBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRangeCString_success_indexAndRangeBeyondSize_bufferExpanded,0,
                  0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRangeCString_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRangeCString_failure_indexAndRangeBeyondSize_bufferExpansionFailed
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeCString_failure_nullptrDestString,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_replaceRangeAString");
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_success_indexAndRangeInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_success_zeroCount,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_success_nullptrReplaceString,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_success_smallerReplaceLength,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_success_biggerReplaceLength,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_success_biggerReplaceLength_bufferExpanded
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_success_zeroReplaceLength,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_success_indexInBoundsRangeBeyondSize,0,0,0
                  ,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRangeAString_success_indexInBoundsRangeBeyondSize_bufferExpanded
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_success_indexAndRangeBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRangeAString_success_indexAndRangeBeyondSize_bufferExpanded,0,
                  0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRangeAString_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceRangeAString_failure_indexAndRangeBeyondSize_bufferExpansionFailed
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceRangeAString_failure_nullptrDestString,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_replace");
  _tcase_add_test(pTVar1,test_AString_replace_allOccurrences,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replace_notAllOccurrences,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replace_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_replaceCString");
  _tcase_add_test(pTVar1,test_AString_replaceCString_success_allOccurrences,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceCString_success_notAllOccurrences,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceCString_success_oldEqualLengthToRep,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceCString_success_oldSmallerLengthThanRep,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceCString_success_oldSmallerLengthThanRep_bufferExpanded,
                  0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceCString_success_oldBiggerLengthThanRep,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceCString_success_nullptrRepArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceCString_success_zeroLengthRep,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceCString_failure_nullptrOldArray,0,0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceCString_failure_oldSmallerLengthThanRep_bufferExpansionFailed,
                  0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceCString_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_replaceAString");
  _tcase_add_test(pTVar1,test_AString_replaceAString_success_allOccurrences,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceAString_success_notAllOccurrences,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceAString_success_oldEqualLengthToRep,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceAString_success_oldSmallerLengthThanRep,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceAString_success_oldSmallerLengthThanRep_bufferExpanded,
                  0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceAString_success_oldBiggerLengthThanRep,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceAString_success_nullptrRepString,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceAString_success_zeroLengthRep,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceAString_failure_nullptrOldString,0,0,0,1);
  _tcase_add_test(pTVar1,
                  test_AString_replaceAString_failure_oldSmallerLengthThanRep_bufferExpansionFailed,
                  0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_replaceAString_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_equals");
  _tcase_add_test(pTVar1,test_AString_equals_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_equals_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_equalsCString");
  _tcase_add_test(pTVar1,test_AString_equalsCString_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_equalsCString_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_compare");
  _tcase_add_test(pTVar1,test_AString_compare_equals,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_compare_firstLessThanSecond,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_compare_firstGreaterThanSecond,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_compare_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_compareCString");
  _tcase_add_test(pTVar1,test_AString_compareCString_equals,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_compareCString_firstLessThanSecond,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_compareCString_firstGreaterThanSecond,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_compareCString_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_substring");
  _tcase_add_test(pTVar1,test_AString_substring_indexRangeInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_substring_rangeBeyondBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_substring_indexBeyondBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_substring_reallocationFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_substring_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_clone");
  _tcase_add_test(pTVar1,test_AString_clone_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_clone_noMemoryAvailable,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_clone_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_substring");
  _tcase_add_test(pTVar1,test_AString_substring_indexRangeInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_substring_rangeBeyondBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_substring_indexBeyondBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_substring_reallocationFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_substring_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("AString Test Case: AString_split");
  _tcase_add_test(pTVar1,test_AString_split_emptyString,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_split_noDelimiter,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_split_firstCharDelimiter,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_split_lastCharDelimiter,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_split_multipleDelimiters,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_split_multipleDelimiters_discardEmpty,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_split_noMemoryAvailable,0,0,0,1);
  _tcase_add_test(pTVar1,test_AString_split_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  return s_00;
}

Assistant:

Suite* private_ACUtilsTest_AString_getTestSuite(void)
{
    Suite *s;
    TCase *test_case_AString_construct_destruct, *test_case_AString_reallocator, *test_case_AString_deallocator,
          *test_case_AString_size, *test_case_AString_capacity, *test_case_AString_buffer, *test_case_AString_reserve,
          *test_case_AString_shrinkToFit, *test_case_AString_clear, *test_case_AString_remove, *test_case_AString_trim,
          *test_case_AString_trimFront, *test_case_AString_trimBack, *test_case_AString_insert,
          *test_case_AString_insertCString, *test_case_AString_insertAString, *test_case_AString_append,
          *test_case_AString_appendCString, *test_case_AString_appendAString, *test_case_AString_get,
          *test_case_AString_set, *test_case_AString_setRange, *test_case_AString_replaceRange,
          *test_case_AString_replaceRangeCString, *test_case_AString_replaceRangeAString, *test_case_AString_replace,
          *test_case_AString_replaceCString, *test_case_AString_replaceAString, *test_case_AString_equals,
          *test_case_AString_equalsCString, *test_case_AString_compare, *test_case_AString_compareCString,
          *test_case_AString_clone, *test_case_AString_substring, *test_case_AString_split;

    s = suite_create("AString Test Suite");

    test_case_AString_construct_destruct = tcase_create("AString Test Case: AString_construct / AString_destruct");
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_valid);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_fromCString_valid);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_withAllocator_valid);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_fromCStringWithAllocator_valid);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_withCapacityAndAllocator_valid);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_withAllocator_invalid);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_fromCStringWithAllocator_invalid);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_withCapacityAndAllocator_invalid);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_withAllocator_noMemoryAvailable);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_fromCStringWithAllocator_noMemoryAvailable);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_withCapacityAndAllocator_noMemoryAvailable);
    tcase_add_test(test_case_AString_construct_destruct, test_AString_construct_destruct_nullptr);
    suite_add_tcase(s, test_case_AString_construct_destruct);

    test_case_AString_reallocator = tcase_create("AString Test Case: AString_reallocator");
    tcase_add_test(test_case_AString_reallocator, test_AString_reallocator_valid);
    tcase_add_test(test_case_AString_reallocator, test_AString_reallocator_nullptr);
    suite_add_tcase(s, test_case_AString_reallocator);

    test_case_AString_deallocator = tcase_create("AString Test Case: AString_deallocator");
    tcase_add_test(test_case_AString_deallocator, test_AString_deallocator_valid);
    tcase_add_test(test_case_AString_deallocator, test_AString_deallocator_nullptr);
    suite_add_tcase(s, test_case_AString_deallocator);

    test_case_AString_size = tcase_create("AString Test Case: AString_size");
    tcase_add_test(test_case_AString_size, test_AString_size_valid);
    tcase_add_test(test_case_AString_size, test_AString_size_nullptr);
    suite_add_tcase(s, test_case_AString_size);

    test_case_AString_capacity = tcase_create("AString Test Case: AString_capacity");
    tcase_add_test(test_case_AString_capacity, test_AString_capacity_valid);
    tcase_add_test(test_case_AString_capacity, test_AString_capacity_nullptr);
    suite_add_tcase(s, test_case_AString_capacity);

    test_case_AString_buffer = tcase_create("AString Test Case: AString_buffer");
    tcase_add_test(test_case_AString_buffer, test_AString_buffer_valid);
    tcase_add_test(test_case_AString_buffer, test_AString_buffer_nullptr);
    suite_add_tcase(s, test_case_AString_buffer);

    test_case_AString_reserve = tcase_create("AString Test Case: AString_reserve");
    tcase_add_test(test_case_AString_reserve, test_AString_reserve_success_enoughCapacity);
    tcase_add_test(test_case_AString_reserve, test_AString_reserve_success_notEnoughCapacity);
    tcase_add_test(test_case_AString_reserve, test_AString_reserve_success_notEnoughCapacity_overMaxAlloc);
    tcase_add_test(test_case_AString_reserve, test_AString_reserve_failure_noMemoryAvailable);
    tcase_add_test(test_case_AString_reserve, test_AString_reserve_failure_nullptr);
    suite_add_tcase(s, test_case_AString_reserve);

    test_case_AString_shrinkToFit = tcase_create("AString Test Case: AString_shrinkToFit");
    tcase_add_test(test_case_AString_shrinkToFit, test_AString_shrinkToFit_success_hasLeastCapacity);
    tcase_add_test(test_case_AString_shrinkToFit, test_AString_shrinkToFit_success_smallerThanMinSize);
    tcase_add_test(test_case_AString_shrinkToFit, test_AString_shrinkToFit_success_hasNotLeastCapacity);
    tcase_add_test(test_case_AString_shrinkToFit, test_AString_shrinkToFit_failure_noMemoryAvailable);
    tcase_add_test(test_case_AString_shrinkToFit, test_AString_shrinkToFit_failure_nullptr);
    suite_add_tcase(s, test_case_AString_shrinkToFit);

    test_case_AString_clear = tcase_create("AString Test Case: AString_clear");
    tcase_add_test(test_case_AString_clear, test_AString_clear);
    tcase_add_test(test_case_AString_clear, test_AString_clear_nullptr);
    suite_add_tcase(s, test_case_AString_clear);

    test_case_AString_remove = tcase_create("AString Test Case: AString_remove");
    tcase_add_test(test_case_AString_remove, test_AString_remove_indexRangeInBounds);
    tcase_add_test(test_case_AString_remove, test_AString_remove_rangeBeyondBounds);
    tcase_add_test(test_case_AString_remove, test_AString_remove_zeroRange);
    tcase_add_test(test_case_AString_remove, test_AString_remove_indexBeyoundBounds);
    tcase_add_test(test_case_AString_remove, test_AString_remove_nullptr);
    suite_add_tcase(s, test_case_AString_remove);

    test_case_AString_trim = tcase_create("AString Test Case: AString_trim");
    tcase_add_test(test_case_AString_trim, test_AString_trim_trimmed);
    tcase_add_test(test_case_AString_trim, test_AString_trim_frontTrimming);
    tcase_add_test(test_case_AString_trim, test_AString_trim_backTrimming);
    tcase_add_test(test_case_AString_trim, test_AString_trim_frontAndBackTrimming);
    tcase_add_test(test_case_AString_trim, test_AString_trim_completeString);
    tcase_add_test(test_case_AString_trim, test_AString_trim_nullptr);
    suite_add_tcase(s, test_case_AString_trim);

    test_case_AString_trimFront = tcase_create("AString Test Case: AString_trimFront");
    tcase_add_test(test_case_AString_trimFront, test_AString_trimFront_trimmed);
    tcase_add_test(test_case_AString_trimFront, test_AString_trimFront_trimming);
    tcase_add_test(test_case_AString_trimFront, test_AString_trimFront_completeString);
    tcase_add_test(test_case_AString_trimFront, test_AString_trimFront_nullptr);
    suite_add_tcase(s, test_case_AString_trimFront);

    test_case_AString_trimBack = tcase_create("AString Test Case: AString_trimBack");
    tcase_add_test(test_case_AString_trimBack, test_AString_trimBack_trimmed);
    tcase_add_test(test_case_AString_trimBack, test_AString_trimBack_trimming);
    tcase_add_test(test_case_AString_trimBack, test_AString_trimBack_completeString);
    tcase_add_test(test_case_AString_trimBack, test_AString_trimBack_nullptr);
    suite_add_tcase(s, test_case_AString_trimBack);

    test_case_AString_insert = tcase_create("AString Test Case: AString_insert");
    tcase_add_test(test_case_AString_insert, test_AString_insert_success_zeroIndex);
    tcase_add_test(test_case_AString_insert, test_AString_insert_success_middleIndex);
    tcase_add_test(test_case_AString_insert, test_AString_insert_success_beyondEndIndex);
    tcase_add_test(test_case_AString_insert, test_AString_insert_success_nullTerminator);
    tcase_add_test(test_case_AString_insert, test_AString_insert_success_bufferExpanded);
    tcase_add_test(test_case_AString_insert, test_AString_insert_failure_bufferExpansionFailed);
    tcase_add_test(test_case_AString_insert, test_AString_insert_failure_nullptr);
    suite_add_tcase(s, test_case_AString_insert);

    test_case_AString_insertCString = tcase_create("AString Test Case: AString_insertCString");
    tcase_add_test(test_case_AString_insertCString, test_AString_insertCString_success_zeroIndex);
    tcase_add_test(test_case_AString_insertCString, test_AString_insertCString_success_middleIndex);
    tcase_add_test(test_case_AString_insertCString, test_AString_insertCString_success_endIndex);
    tcase_add_test(test_case_AString_insertCString, test_AString_insertCString_success_beyondEndIndex);
    tcase_add_test(test_case_AString_insertCString, test_AString_insertArray_success_bufferExpanded);
    tcase_add_test(test_case_AString_insertCString, test_AString_insertArray_success_nullptrArray);
    tcase_add_test(test_case_AString_insertCString, test_AString_insertArray_success_zeroArraySize);
    tcase_add_test(test_case_AString_insertCString, test_AString_insertArray_failure_bufferExpansionFailed);
    tcase_add_test(test_case_AString_insertCString, test_AString_insertArray_failure_nullptrDestArray);
    suite_add_tcase(s, test_case_AString_insertCString);

    test_case_AString_insertAString = tcase_create("AString Test Case: AString_insertAString");
    tcase_add_test(test_case_AString_insertAString, test_AString_insertAString_success_zeroIndex);
    tcase_add_test(test_case_AString_insertAString, test_AString_insertAString_success_middleIndex);
    tcase_add_test(test_case_AString_insertAString, test_AString_insertAString_success_endIndex);
    tcase_add_test(test_case_AString_insertAString, test_AString_insertAString_success_beyondEndIndex);
    tcase_add_test(test_case_AString_insertAString, test_AString_insertAString_success_bufferExpanded);
    tcase_add_test(test_case_AString_insertAString, test_AString_insertAString_success_nullptrSrcArray);
    tcase_add_test(test_case_AString_insertAString, test_AString_insertAString_success_zeroSizeSrcArray);
    tcase_add_test(test_case_AString_insertAString, test_AString_insertAString_failure_bufferExpansionFailed);
    tcase_add_test(test_case_AString_insertAString, test_AString_insertAString_failure_nullptrDestArray);
    suite_add_tcase(s, test_case_AString_insertAString);

    test_case_AString_append = tcase_create("AString Test Case: AString_append");
    tcase_add_test(test_case_AString_append, test_AString_append_success_enoughCapacity);
    tcase_add_test(test_case_AString_append, test_AString_append_success_nullTerminator);
    tcase_add_test(test_case_AString_append, test_AString_append_success_notEnoughCapacity);
    tcase_add_test(test_case_AString_append, test_AString_append_failure_bufferExpansionFailed);
    tcase_add_test(test_case_AString_append, test_AString_append_failure_nullptr);
    suite_add_tcase(s, test_case_AString_append);

    test_case_AString_appendCString = tcase_create("AString Test Case: AString_appendCString");
    tcase_add_test(test_case_AString_appendCString, test_AString_appendCString_success_enoughCapacity);
    tcase_add_test(test_case_AString_appendCString, test_AString_appendCString_success_notEnoughCapacity);
    tcase_add_test(test_case_AString_appendCString, test_AString_appendCString_success_nullptrArray);
    tcase_add_test(test_case_AString_appendCString, test_AString_appendCString_success_zeroArraySize);
    tcase_add_test(test_case_AString_appendCString, test_AString_appendCString_failure_bufferExpansionFailed);
    tcase_add_test(test_case_AString_appendCString, test_AString_appendCString_failure_nullptrDestArray);
    suite_add_tcase(s, test_case_AString_appendCString);

    test_case_AString_appendAString = tcase_create("AString Test Case: AString_appendAString");
    tcase_add_test(test_case_AString_appendAString, test_AString_appendAString_success_enoughCapacity);
    tcase_add_test(test_case_AString_appendAString, test_AString_appendAString_success_notEnoughCapacity);
    tcase_add_test(test_case_AString_appendAString, test_AString_appendAString_success_nullptrSrcArray);
    tcase_add_test(test_case_AString_appendAString, test_AString_appendAString_success_zeroSizeSrcArray);
    tcase_add_test(test_case_AString_appendAString, test_AString_appendAString_failure_bufferExpansionFailed);
    tcase_add_test(test_case_AString_appendAString, test_AString_appendAString_failure_nullptrDestArray);
    suite_add_tcase(s, test_case_AString_appendAString);

    test_case_AString_get = tcase_create("AString Test Case: AString_get");
    tcase_add_test(test_case_AString_get, test_AString_get_indexInBounds);
    tcase_add_test(test_case_AString_get, test_AString_get_indexOutOfBounds);
    tcase_add_test(test_case_AString_get, test_AString_get_nullptr);
    suite_add_tcase(s, test_case_AString_get);

    test_case_AString_set = tcase_create("AString Test Case: AString_set");
    tcase_add_test(test_case_AString_set, test_AString_set_success_indexInBounds);
    tcase_add_test(test_case_AString_set, test_AString_set_success_indexBeyondSize);
    tcase_add_test(test_case_AString_set, test_AString_set_success_indexBeyondSize_bufferExpanded);
    tcase_add_test(test_case_AString_set, test_AString_set_failure_indexBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_AString_set, test_AString_set_failure_nullptr);
    suite_add_tcase(s, test_case_AString_set);

    test_case_AString_setRange = tcase_create("AString Test Case: AString_setRange");
    tcase_add_test(test_case_AString_setRange, test_AString_setRange_success_indexAndRangeInBounds);
    tcase_add_test(test_case_AString_setRange, test_AString_setRange_success_indexInBoundsRangeBeyondSize);
    tcase_add_test(test_case_AString_setRange, test_AString_setRange_success_indexInBoundsRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_AString_setRange, test_AString_setRange_success_indexAndRangeBeyondSize);
    tcase_add_test(test_case_AString_setRange, test_AString_setRange_success_indexAndRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_AString_setRange, test_AString_setRange_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_AString_setRange, test_AString_setRange_failure_indexAndRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_AString_setRange, test_AString_setRange_failure_nullptr);
    suite_add_tcase(s, test_case_AString_setRange);

    test_case_AString_replaceRange = tcase_create("AString Test Case: AString_replaceRange");
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_indexAndRangeInBounds);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_zeroCount);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_smallerReplaceLength);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_biggerReplaceLength);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_biggerReplaceLength_bufferExpanded);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_zeroReplaceLength);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_indexInBoundsRangeBeyondSize);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_indexInBoundsRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_indexAndRangeBeyondSize);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_success_indexAndRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_failure_indexAndRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_AString_replaceRange, test_AString_replaceRange_failure_nullptrDestString);
    suite_add_tcase(s, test_case_AString_replaceRange);

    test_case_AString_replaceRangeCString = tcase_create("AString Test Case: AString_replaceRangeCString");
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_indexAndRangeInBounds);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_zeroCount);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_notAllOfReplaceArray);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_nullptrReplaceArray);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_smallerReplaceLength);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_biggerReplaceLength);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_biggerReplaceLength_bufferExpanded);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_zeroReplaceLength);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_indexInBoundsRangeBeyondSize);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_indexInBoundsRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_indexAndRangeBeyondSize);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_success_indexAndRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_failure_indexAndRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_AString_replaceRangeCString, test_AString_replaceRangeCString_failure_nullptrDestString);
    suite_add_tcase(s, test_case_AString_replaceRangeCString);

    test_case_AString_replaceRangeAString = tcase_create("AString Test Case: AString_replaceRangeAString");
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_indexAndRangeInBounds);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_zeroCount);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_nullptrReplaceString);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_smallerReplaceLength);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_biggerReplaceLength);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_biggerReplaceLength_bufferExpanded);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_zeroReplaceLength);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_indexInBoundsRangeBeyondSize);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_indexInBoundsRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_indexAndRangeBeyondSize);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_success_indexAndRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_failure_indexAndRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_AString_replaceRangeAString, test_AString_replaceRangeAString_failure_nullptrDestString);
    suite_add_tcase(s, test_case_AString_replaceRangeAString);

    test_case_AString_replace = tcase_create("AString Test Case: AString_replace");
    tcase_add_test(test_case_AString_replace, test_AString_replace_allOccurrences);
    tcase_add_test(test_case_AString_replace, test_AString_replace_notAllOccurrences);
    tcase_add_test(test_case_AString_replace, test_AString_replace_nullptr);
    suite_add_tcase(s, test_case_AString_replace);

    test_case_AString_replaceCString = tcase_create("AString Test Case: AString_replaceCString");
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_success_allOccurrences);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_success_notAllOccurrences);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_success_oldEqualLengthToRep);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_success_oldSmallerLengthThanRep);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_success_oldSmallerLengthThanRep_bufferExpanded);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_success_oldBiggerLengthThanRep);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_success_nullptrRepArray);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_success_zeroLengthRep);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_failure_nullptrOldArray);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_failure_oldSmallerLengthThanRep_bufferExpansionFailed);
    tcase_add_test(test_case_AString_replaceCString, test_AString_replaceCString_failure_nullptr);
    suite_add_tcase(s, test_case_AString_replaceCString);

    test_case_AString_replaceAString = tcase_create("AString Test Case: AString_replaceAString");
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_success_allOccurrences);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_success_notAllOccurrences);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_success_oldEqualLengthToRep);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_success_oldSmallerLengthThanRep);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_success_oldSmallerLengthThanRep_bufferExpanded);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_success_oldBiggerLengthThanRep);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_success_nullptrRepString);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_success_zeroLengthRep);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_failure_nullptrOldString);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_failure_oldSmallerLengthThanRep_bufferExpansionFailed);
    tcase_add_test(test_case_AString_replaceAString, test_AString_replaceAString_failure_nullptr);
    suite_add_tcase(s, test_case_AString_replaceAString);

    test_case_AString_equals = tcase_create("AString Test Case: AString_equals");
    tcase_add_test(test_case_AString_equals, test_AString_equals_valid);
    tcase_add_test(test_case_AString_equals, test_AString_equals_nullptr);
    suite_add_tcase(s, test_case_AString_equals);

    test_case_AString_equalsCString = tcase_create("AString Test Case: AString_equalsCString");
    tcase_add_test(test_case_AString_equalsCString, test_AString_equalsCString_valid);
    tcase_add_test(test_case_AString_equalsCString, test_AString_equalsCString_nullptr);
    suite_add_tcase(s, test_case_AString_equalsCString);

    test_case_AString_compare = tcase_create("AString Test Case: AString_compare");
    tcase_add_test(test_case_AString_compare, test_AString_compare_equals);
    tcase_add_test(test_case_AString_compare, test_AString_compare_firstLessThanSecond);
    tcase_add_test(test_case_AString_compare, test_AString_compare_firstGreaterThanSecond);
    tcase_add_test(test_case_AString_compare, test_AString_compare_nullptr);
    suite_add_tcase(s, test_case_AString_compare);

    test_case_AString_compareCString = tcase_create("AString Test Case: AString_compareCString");
    tcase_add_test(test_case_AString_compareCString, test_AString_compareCString_equals);
    tcase_add_test(test_case_AString_compareCString, test_AString_compareCString_firstLessThanSecond);
    tcase_add_test(test_case_AString_compareCString, test_AString_compareCString_firstGreaterThanSecond);
    tcase_add_test(test_case_AString_compareCString, test_AString_compareCString_nullptr);
    suite_add_tcase(s, test_case_AString_compareCString);

    test_case_AString_substring = tcase_create("AString Test Case: AString_substring");
    tcase_add_test(test_case_AString_substring, test_AString_substring_indexRangeInBounds);
    tcase_add_test(test_case_AString_substring, test_AString_substring_rangeBeyondBounds);
    tcase_add_test(test_case_AString_substring, test_AString_substring_indexBeyondBounds);
    tcase_add_test(test_case_AString_substring, test_AString_substring_reallocationFailed);
    tcase_add_test(test_case_AString_substring, test_AString_substring_nullptr);
    suite_add_tcase(s, test_case_AString_substring);

    test_case_AString_clone = tcase_create("AString Test Case: AString_clone");
    tcase_add_test(test_case_AString_clone, test_AString_clone_valid);
    tcase_add_test(test_case_AString_clone, test_AString_clone_noMemoryAvailable);
    tcase_add_test(test_case_AString_clone, test_AString_clone_nullptr);
    suite_add_tcase(s, test_case_AString_clone);

    test_case_AString_substring = tcase_create("AString Test Case: AString_substring");
    tcase_add_test(test_case_AString_substring, test_AString_substring_indexRangeInBounds);
    tcase_add_test(test_case_AString_substring, test_AString_substring_rangeBeyondBounds);
    tcase_add_test(test_case_AString_substring, test_AString_substring_indexBeyondBounds);
    tcase_add_test(test_case_AString_substring, test_AString_substring_reallocationFailed);
    tcase_add_test(test_case_AString_substring, test_AString_substring_nullptr);
    suite_add_tcase(s, test_case_AString_substring);

    test_case_AString_split = tcase_create("AString Test Case: AString_split");
    tcase_add_test(test_case_AString_split, test_AString_split_emptyString);
    tcase_add_test(test_case_AString_split, test_AString_split_noDelimiter);
    tcase_add_test(test_case_AString_split, test_AString_split_firstCharDelimiter);
    tcase_add_test(test_case_AString_split, test_AString_split_lastCharDelimiter);
    tcase_add_test(test_case_AString_split, test_AString_split_multipleDelimiters);
    tcase_add_test(test_case_AString_split, test_AString_split_multipleDelimiters_discardEmpty);
    tcase_add_test(test_case_AString_split, test_AString_split_noMemoryAvailable);
    tcase_add_test(test_case_AString_split, test_AString_split_nullptr);
    suite_add_tcase(s, test_case_AString_split);
    
    return s;
}